

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::PopulateTcParseEntries
          (Reflection *this,TailCallTableInfo *table_info,FieldEntry *entries)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  reference pFVar4;
  OneofDescriptor *this_00;
  char *pcVar5;
  int __c;
  FieldDescriptor *this_01;
  OneofDescriptor *oneof;
  FieldDescriptor *field;
  FieldEntryInfo *entry;
  iterator __end2;
  iterator __begin2;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  *__range2;
  FieldEntry *entries_local;
  TailCallTableInfo *table_info_local;
  Reflection *this_local;
  
  __end2 = std::
           vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           ::begin(&table_info->field_entries);
  entry = (FieldEntryInfo *)
          std::
          vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
          ::end(&table_info->field_entries);
  __range2 = (vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
              *)entries;
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>_>
                                     *)&entry), bVar2) {
    pFVar4 = __gnu_cxx::
             __normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>_>
             ::operator*(&__end2);
    this_01 = pFVar4->field;
    this_00 = FieldDescriptor::real_containing_oneof(this_01);
    uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,this_01);
    *(uint32_t *)
     &(__range2->
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
      )._M_impl.super__Vector_impl_data._M_start = uVar3;
    if (this_00 == (OneofDescriptor *)0x0) {
      bVar2 = internal::ReflectionSchema::HasHasbits(&this->schema_);
      if (bVar2) {
        uVar3 = internal::ReflectionSchema::HasBitsOffset(&this->schema_);
        *(uint32_t *)
         ((long)&(__range2->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4) = uVar3 * 8 + pFVar4->hasbit_idx;
      }
      else {
        *(undefined4 *)
         ((long)&(__range2->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4) = 0;
      }
    }
    else {
      iVar1 = (this->schema_).oneof_case_offset_;
      pcVar5 = OneofDescriptor::index(this_00,(char *)this_01,__c);
      *(int *)((long)&(__range2->
                      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4) = iVar1 + (int)pcVar5 * 4;
    }
    *(uint16_t *)
     &(__range2->
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
      )._M_impl.super__Vector_impl_data._M_finish = pFVar4->aux_idx;
    *(uint16_t *)
     ((long)&(__range2->
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish + 2) = pFVar4->type_card;
    __range2 = (vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                *)((long)&(__range2->
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
                          )._M_impl.super__Vector_impl_data._M_finish + 4);
    __gnu_cxx::
    __normal_iterator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Reflection::PopulateTcParseEntries(
    internal::TailCallTableInfo& table_info,
    TcParseTableBase::FieldEntry* entries) const {
  for (const auto& entry : table_info.field_entries) {
    const FieldDescriptor* field = entry.field;
    const OneofDescriptor* oneof = field->real_containing_oneof();
    entries->offset = schema_.GetFieldOffset(field);
    if (oneof != nullptr) {
      entries->has_idx = schema_.oneof_case_offset_ + 4 * oneof->index();
    } else if (schema_.HasHasbits()) {
      entries->has_idx =
          static_cast<int>(8 * schema_.HasBitsOffset() + entry.hasbit_idx);
    } else {
      entries->has_idx = 0;
    }
    entries->aux_idx = entry.aux_idx;
    entries->type_card = entry.type_card;
    ++entries;
  }
}